

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

ECPtr * loguru::get_thread_ec_head_ref(void)

{
  ECPtr *local_10;
  ECPtr *ec;
  
  pthread_once(&s_ec_pthread_once,ec_make_pthread_key);
  local_10 = (ECPtr *)pthread_getspecific(s_ec_pthread_key);
  if (local_10 == (ECPtr *)0x0) {
    local_10 = (ECPtr *)operator_new(8);
    *local_10 = (ECPtr)0x0;
    pthread_setspecific(s_ec_pthread_key,local_10);
  }
  return local_10;
}

Assistant:

ECPtr& get_thread_ec_head_ref()
	{
		(void)pthread_once(&s_ec_pthread_once, ec_make_pthread_key);
		auto ec = reinterpret_cast<ECPtr*>(pthread_getspecific(s_ec_pthread_key));
		if (ec == nullptr) {
			ec = new ECPtr(nullptr);
			(void)pthread_setspecific(s_ec_pthread_key, ec);
		}
		return *ec;
	}